

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O1

void rtcForwardIntersect16Ex
               (int *valid,RTCIntersectFunctionNArguments *args,RTCScene hscene,RTCRay16 *iray,
               uint instID,uint instPrimID)

{
  RTCRayQueryContext *pRVar1;
  RTCRayHitN *pRVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  Scene *scene;
  RayQueryContext context;
  
  pRVar1 = args->context;
  pRVar2 = args->rayhit;
  uVar6 = *(undefined8 *)pRVar2;
  uVar7 = *(undefined8 *)(pRVar2 + 8);
  uVar8 = *(undefined8 *)(pRVar2 + 0x10);
  uVar9 = *(undefined8 *)(pRVar2 + 0x18);
  uVar10 = *(undefined8 *)(pRVar2 + 0x20);
  uVar11 = *(undefined8 *)(pRVar2 + 0x28);
  uVar12 = *(undefined8 *)(pRVar2 + 0x30);
  uVar13 = *(undefined8 *)(pRVar2 + 0x38);
  uVar14 = *(undefined8 *)(pRVar2 + 0x40);
  uVar15 = *(undefined8 *)(pRVar2 + 0x48);
  uVar16 = *(undefined8 *)(pRVar2 + 0x50);
  uVar17 = *(undefined8 *)(pRVar2 + 0x58);
  uVar18 = *(undefined8 *)(pRVar2 + 0x60);
  uVar19 = *(undefined8 *)(pRVar2 + 0x68);
  uVar20 = *(undefined8 *)(pRVar2 + 0x70);
  uVar21 = *(undefined8 *)(pRVar2 + 0x78);
  uVar22 = *(undefined8 *)(pRVar2 + 0x80);
  uVar23 = *(undefined8 *)(pRVar2 + 0x88);
  uVar24 = *(undefined8 *)(pRVar2 + 0x90);
  uVar25 = *(undefined8 *)(pRVar2 + 0x98);
  uVar26 = *(undefined8 *)(pRVar2 + 0xa0);
  uVar27 = *(undefined8 *)(pRVar2 + 0xa8);
  uVar28 = *(undefined8 *)(pRVar2 + 0xb0);
  uVar29 = *(undefined8 *)(pRVar2 + 0xb8);
  uVar30 = *(undefined8 *)(pRVar2 + 0x100);
  uVar31 = *(undefined8 *)(pRVar2 + 0x108);
  uVar32 = *(undefined8 *)(pRVar2 + 0x110);
  uVar33 = *(undefined8 *)(pRVar2 + 0x118);
  uVar34 = *(undefined8 *)(pRVar2 + 0x120);
  uVar35 = *(undefined8 *)(pRVar2 + 0x128);
  uVar36 = *(undefined8 *)(pRVar2 + 0x130);
  uVar37 = *(undefined8 *)(pRVar2 + 0x138);
  uVar38 = *(undefined8 *)(pRVar2 + 0x140);
  uVar39 = *(undefined8 *)(pRVar2 + 0x148);
  uVar40 = *(undefined8 *)(pRVar2 + 0x150);
  uVar41 = *(undefined8 *)(pRVar2 + 0x158);
  uVar42 = *(undefined8 *)(pRVar2 + 0x160);
  uVar43 = *(undefined8 *)(pRVar2 + 0x168);
  uVar44 = *(undefined8 *)(pRVar2 + 0x170);
  uVar45 = *(undefined8 *)(pRVar2 + 0x178);
  uVar46 = *(undefined8 *)(pRVar2 + 0x180);
  uVar47 = *(undefined8 *)(pRVar2 + 0x188);
  uVar48 = *(undefined8 *)(pRVar2 + 400);
  uVar49 = *(undefined8 *)(pRVar2 + 0x198);
  uVar50 = *(undefined8 *)(pRVar2 + 0x1a0);
  uVar51 = *(undefined8 *)(pRVar2 + 0x1a8);
  uVar52 = *(undefined8 *)(pRVar2 + 0x1b0);
  uVar53 = *(undefined8 *)(pRVar2 + 0x1b8);
  uVar54 = *(undefined8 *)(iray->org_x + 2);
  *(undefined8 *)pRVar2 = *(undefined8 *)iray->org_x;
  *(undefined8 *)(pRVar2 + 8) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_x + 6);
  *(undefined8 *)(pRVar2 + 0x10) = *(undefined8 *)(iray->org_x + 4);
  *(undefined8 *)(pRVar2 + 0x18) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_x + 10);
  *(undefined8 *)(pRVar2 + 0x20) = *(undefined8 *)(iray->org_x + 8);
  *(undefined8 *)(pRVar2 + 0x28) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_x + 0xe);
  *(undefined8 *)(pRVar2 + 0x30) = *(undefined8 *)(iray->org_x + 0xc);
  *(undefined8 *)(pRVar2 + 0x38) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_y + 2);
  *(undefined8 *)(pRVar2 + 0x40) = *(undefined8 *)iray->org_y;
  *(undefined8 *)(pRVar2 + 0x48) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_y + 6);
  *(undefined8 *)(pRVar2 + 0x50) = *(undefined8 *)(iray->org_y + 4);
  *(undefined8 *)(pRVar2 + 0x58) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_y + 10);
  *(undefined8 *)(pRVar2 + 0x60) = *(undefined8 *)(iray->org_y + 8);
  *(undefined8 *)(pRVar2 + 0x68) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_y + 0xe);
  *(undefined8 *)(pRVar2 + 0x70) = *(undefined8 *)(iray->org_y + 0xc);
  *(undefined8 *)(pRVar2 + 0x78) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_z + 2);
  *(undefined8 *)(pRVar2 + 0x80) = *(undefined8 *)iray->org_z;
  *(undefined8 *)(pRVar2 + 0x88) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_z + 6);
  *(undefined8 *)(pRVar2 + 0x90) = *(undefined8 *)(iray->org_z + 4);
  *(undefined8 *)(pRVar2 + 0x98) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_z + 10);
  *(undefined8 *)(pRVar2 + 0xa0) = *(undefined8 *)(iray->org_z + 8);
  *(undefined8 *)(pRVar2 + 0xa8) = uVar54;
  uVar54 = *(undefined8 *)(iray->org_z + 0xe);
  *(undefined8 *)(pRVar2 + 0xb0) = *(undefined8 *)(iray->org_z + 0xc);
  *(undefined8 *)(pRVar2 + 0xb8) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_x + 2);
  *(undefined8 *)(pRVar2 + 0x100) = *(undefined8 *)iray->dir_x;
  *(undefined8 *)(pRVar2 + 0x108) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_x + 6);
  *(undefined8 *)(pRVar2 + 0x110) = *(undefined8 *)(iray->dir_x + 4);
  *(undefined8 *)(pRVar2 + 0x118) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_x + 10);
  *(undefined8 *)(pRVar2 + 0x120) = *(undefined8 *)(iray->dir_x + 8);
  *(undefined8 *)(pRVar2 + 0x128) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_x + 0xe);
  *(undefined8 *)(pRVar2 + 0x130) = *(undefined8 *)(iray->dir_x + 0xc);
  *(undefined8 *)(pRVar2 + 0x138) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_y + 2);
  *(undefined8 *)(pRVar2 + 0x140) = *(undefined8 *)iray->dir_y;
  *(undefined8 *)(pRVar2 + 0x148) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_y + 6);
  *(undefined8 *)(pRVar2 + 0x150) = *(undefined8 *)(iray->dir_y + 4);
  *(undefined8 *)(pRVar2 + 0x158) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_y + 10);
  *(undefined8 *)(pRVar2 + 0x160) = *(undefined8 *)(iray->dir_y + 8);
  *(undefined8 *)(pRVar2 + 0x168) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_y + 0xe);
  *(undefined8 *)(pRVar2 + 0x170) = *(undefined8 *)(iray->dir_y + 0xc);
  *(undefined8 *)(pRVar2 + 0x178) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_z + 2);
  *(undefined8 *)(pRVar2 + 0x180) = *(undefined8 *)iray->dir_z;
  *(undefined8 *)(pRVar2 + 0x188) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_z + 6);
  *(undefined8 *)(pRVar2 + 400) = *(undefined8 *)(iray->dir_z + 4);
  *(undefined8 *)(pRVar2 + 0x198) = uVar54;
  uVar54 = *(undefined8 *)(iray->dir_z + 10);
  *(undefined8 *)(pRVar2 + 0x1a0) = *(undefined8 *)(iray->dir_z + 8);
  *(undefined8 *)(pRVar2 + 0x1a8) = uVar54;
  fVar3 = iray->dir_z[0xd];
  fVar4 = iray->dir_z[0xe];
  fVar5 = iray->dir_z[0xf];
  *(float *)(pRVar2 + 0x1b0) = iray->dir_z[0xc];
  *(float *)(pRVar2 + 0x1b4) = fVar3;
  *(float *)(pRVar2 + 0x1b8) = fVar4;
  *(float *)(pRVar2 + 0x1bc) = fVar5;
  context.args = *(RTCIntersectArguments **)&args[1].primID;
  if (pRVar1->instID[0] == 0xffffffff) {
    pRVar1->instID[0] = instID;
    pRVar1->instPrimID[0] = instPrimID;
  }
  context.scene = (Scene *)hscene;
  context.user = pRVar1;
  (**(code **)(hscene + 0x128))(valid,hscene + 0x58,pRVar2,&context);
  pRVar1->instID[0] = 0xffffffff;
  pRVar1->instPrimID[0] = 0xffffffff;
  *(undefined8 *)pRVar2 = uVar6;
  *(undefined8 *)(pRVar2 + 8) = uVar7;
  *(undefined8 *)(pRVar2 + 0x10) = uVar8;
  *(undefined8 *)(pRVar2 + 0x18) = uVar9;
  *(undefined8 *)(pRVar2 + 0x20) = uVar10;
  *(undefined8 *)(pRVar2 + 0x28) = uVar11;
  *(undefined8 *)(pRVar2 + 0x30) = uVar12;
  *(undefined8 *)(pRVar2 + 0x38) = uVar13;
  *(undefined8 *)(pRVar2 + 0x40) = uVar14;
  *(undefined8 *)(pRVar2 + 0x48) = uVar15;
  *(undefined8 *)(pRVar2 + 0x50) = uVar16;
  *(undefined8 *)(pRVar2 + 0x58) = uVar17;
  *(undefined8 *)(pRVar2 + 0x60) = uVar18;
  *(undefined8 *)(pRVar2 + 0x68) = uVar19;
  *(undefined8 *)(pRVar2 + 0x70) = uVar20;
  *(undefined8 *)(pRVar2 + 0x78) = uVar21;
  *(undefined8 *)(pRVar2 + 0x80) = uVar22;
  *(undefined8 *)(pRVar2 + 0x88) = uVar23;
  *(undefined8 *)(pRVar2 + 0x90) = uVar24;
  *(undefined8 *)(pRVar2 + 0x98) = uVar25;
  *(undefined8 *)(pRVar2 + 0xa0) = uVar26;
  *(undefined8 *)(pRVar2 + 0xa8) = uVar27;
  *(undefined8 *)(pRVar2 + 0xb0) = uVar28;
  *(undefined8 *)(pRVar2 + 0xb8) = uVar29;
  *(undefined8 *)(pRVar2 + 0x100) = uVar30;
  *(undefined8 *)(pRVar2 + 0x108) = uVar31;
  *(undefined8 *)(pRVar2 + 0x110) = uVar32;
  *(undefined8 *)(pRVar2 + 0x118) = uVar33;
  *(undefined8 *)(pRVar2 + 0x120) = uVar34;
  *(undefined8 *)(pRVar2 + 0x128) = uVar35;
  *(undefined8 *)(pRVar2 + 0x130) = uVar36;
  *(undefined8 *)(pRVar2 + 0x138) = uVar37;
  *(undefined8 *)(pRVar2 + 0x140) = uVar38;
  *(undefined8 *)(pRVar2 + 0x148) = uVar39;
  *(undefined8 *)(pRVar2 + 0x150) = uVar40;
  *(undefined8 *)(pRVar2 + 0x158) = uVar41;
  *(undefined8 *)(pRVar2 + 0x160) = uVar42;
  *(undefined8 *)(pRVar2 + 0x168) = uVar43;
  *(undefined8 *)(pRVar2 + 0x170) = uVar44;
  *(undefined8 *)(pRVar2 + 0x178) = uVar45;
  *(undefined8 *)(pRVar2 + 0x180) = uVar46;
  *(undefined8 *)(pRVar2 + 0x188) = uVar47;
  *(undefined8 *)(pRVar2 + 400) = uVar48;
  *(undefined8 *)(pRVar2 + 0x198) = uVar49;
  *(undefined8 *)(pRVar2 + 0x1a0) = uVar50;
  *(undefined8 *)(pRVar2 + 0x1a8) = uVar51;
  *(undefined8 *)(pRVar2 + 0x1b0) = uVar52;
  *(undefined8 *)(pRVar2 + 0x1b8) = uVar53;
  return;
}

Assistant:

RTC_API void rtcForwardIntersect16Ex(const int* valid, const RTCIntersectFunctionNArguments* args, RTCScene hscene, RTCRay16* iray, unsigned int instID, unsigned int instPrimID)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcForwardIntersect16Ex);
    rtcForwardIntersectN<RTCRay16,RTCRayHit16,16>(valid,args,hscene,iray,instID,instPrimID);
    RTC_CATCH_END2(scene);
  }